

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry_sparse.c
# Opt level: O2

wchar_t archive_entry_sparse_count(archive_entry *entry)

{
  long lVar1;
  la_int64_t lVar2;
  ae_sparse *paVar3;
  wchar_t wVar4;
  
  wVar4 = L'\xffffffff';
  paVar3 = (ae_sparse *)&entry->sparse_head;
  do {
    paVar3 = paVar3->next;
    wVar4 = wVar4 + L'\x01';
  } while (paVar3 != (ae_sparse *)0x0);
  if (wVar4 == L'\x01') {
    paVar3 = entry->sparse_head;
    wVar4 = L'\x01';
    if (paVar3->offset == 0) {
      lVar1 = paVar3->length;
      lVar2 = archive_entry_size(entry);
      if (lVar2 <= lVar1) {
        archive_entry_sparse_clear(entry);
        wVar4 = L'\0';
      }
    }
  }
  return wVar4;
}

Assistant:

int
archive_entry_sparse_count(struct archive_entry *entry)
{
	struct ae_sparse *sp;
	int count = 0;

	for (sp = entry->sparse_head; sp != NULL; sp = sp->next)
		count++;

	/*
	 * Sanity check if this entry is exactly sparse.
	 * If amount of sparse blocks is just one and it indicates the whole
	 * file data, we should remove it and return zero.
	 */
	if (count == 1) {
		sp = entry->sparse_head;
		if (sp->offset == 0 &&
		    sp->length >= archive_entry_size(entry)) {
			count = 0;
			archive_entry_sparse_clear(entry);
		}
	}

	return (count);
}